

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,bool clamp)

{
  ImVec2 IVar1;
  ImDrawVert *pIVar2;
  ImDrawVert *vertex;
  ImDrawVert *pIVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar13._0_4_ = (*b).x - (*a).x;
  auVar13._4_4_ = (*b).y - (*a).y;
  auVar13._8_8_ = 0;
  IVar10 = *uv_b;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = IVar10.x;
  auVar16._4_4_ = IVar10.y;
  IVar1 = *uv_a;
  fVar15 = IVar10.x;
  fVar18 = IVar10.y;
  fVar12 = IVar1.x;
  auVar7._0_4_ = fVar15 - fVar12;
  fVar14 = IVar1.y;
  auVar7._4_4_ = fVar18 - fVar14;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar7,auVar13);
  fVar6 = (float)(auVar7._0_4_ & -(uint)(auVar13._0_4_ != 0.0));
  fVar8 = (float)(auVar7._4_4_ & -(uint)(auVar13._4_4_ != 0.0));
  pIVar2 = (draw_list->VtxBuffer).Data;
  pIVar3 = pIVar2 + vert_start_idx;
  pIVar2 = pIVar2 + vert_end_idx;
  if (clamp) {
    if (vert_start_idx < vert_end_idx) {
      auVar9._8_8_ = 0;
      auVar9._0_4_ = IVar1.x;
      auVar9._4_4_ = IVar1.y;
      auVar7 = minps(auVar9,auVar16);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           CONCAT44(~-(uint)(fVar18 <= fVar14) & (uint)fVar18,
                    ~-(uint)(fVar15 <= fVar12) & (uint)fVar15) |
           CONCAT44((uint)fVar14 & -(uint)(fVar18 <= fVar14),
                    (uint)fVar12 & -(uint)(fVar15 <= fVar12));
      do {
        auVar17._0_4_ = (*uv_a).x + ((pIVar3->pos).x - (*a).x) * fVar6;
        auVar17._4_4_ = (*uv_a).y + ((pIVar3->pos).y - (*a).y) * fVar8;
        auVar17._8_8_ = 0;
        auVar13 = minps(auVar11,auVar17);
        uVar4 = -(uint)(auVar17._0_4_ < auVar7._0_4_);
        uVar5 = -(uint)(auVar17._4_4_ < auVar7._4_4_);
        pIVar3->uv = (ImVec2)(CONCAT44(~uVar5 & auVar13._4_4_,~uVar4 & auVar13._0_4_) |
                             CONCAT44((uint)auVar7._4_4_ & uVar5,(uint)auVar7._0_4_ & uVar4));
        pIVar3 = pIVar3 + 1;
      } while (pIVar3 < pIVar2);
    }
  }
  else if (vert_start_idx < vert_end_idx) {
    do {
      IVar10.x = (*uv_a).x + ((pIVar3->pos).x - (*a).x) * fVar6;
      IVar10.y = (*uv_a).y + ((pIVar3->pos).y - (*a).y) * fVar8;
      pIVar3->uv = IVar10;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 < pIVar2);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}